

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture.cpp
# Opt level: O1

bool __thiscall TestETCaptureLValueLeft::Run(TestETCaptureLValueLeft *this)

{
  Outputter *pOVar1;
  ETCaptureTestValue v;
  undefined4 local_a4;
  string local_a0;
  undefined4 *local_78;
  undefined4 local_70 [2];
  testinator local_68 [8];
  char *local_60;
  undefined4 local_58;
  char *local_50;
  undefined4 *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  undefined4 *local_28;
  char *local_20;
  
  local_78 = &local_a4;
  local_a4 = 1;
  local_28 = local_70;
  local_70[0] = 0;
  pOVar1 = (this->super_Test).m_op;
  local_60 = 
  "EXPECT FAILED: /workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/capture.cpp:"
  ;
  local_58 = 0x25;
  local_50 = " (v == 0 => ";
  local_40 = " ";
  local_38 = "==";
  local_30 = " ";
  local_20 = ")";
  local_48 = local_78;
  testinator::
  Diagnostic<testinator::Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,char_const*>,int>,char_const*>,testinator::stringifier_select<ETCaptureTestValue,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>,char_const*>,char_const*>,testinator::stringifier_select<int,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>>>
            (&local_a0,local_68,
             (Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<ETCaptureTestValue,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
              *)"==");
  (*pOVar1->_vptr_Outputter[3])(pOVar1,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  (this->super_Test).m_success = false;
  return true;
}

Assistant:

virtual bool Run()
  {
    ETCaptureTestValue v;
    EXPECT(v == 0);
    return true;
  }